

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

void __thiscall asmjit::CodeHolder::setErrorHandler(CodeHolder *this,ErrorHandler *errorHandler)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  
  this->_errorHandler = errorHandler;
  uVar2 = (ulong)(this->_emitters).super_ZoneVectorBase._size;
  if (uVar2 != 0) {
    pvVar1 = (this->_emitters).super_ZoneVectorBase._data;
    lVar3 = 0;
    do {
      (**(code **)(**(long **)((long)pvVar1 + lVar3) + 0x90))();
      lVar3 = lVar3 + 8;
    } while (uVar2 << 3 != lVar3);
  }
  return;
}

Assistant:

void CodeHolder::setErrorHandler(ErrorHandler* errorHandler) noexcept {
  _errorHandler = errorHandler;
  CodeHolder_onSettingsUpdated(this);
}